

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void compact_int8_suite::test_empty(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<signed_char,_std::allocator<signed_char>_> data;
  encoder_type encoder;
  undefined8 local_88;
  undefined4 local_7c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Vector_base<signed_char,_std::allocator<signed_char>_> local_58;
  undefined **local_38 [5];
  
  local_38[1] = (undefined **)&local_78;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38[0] = &PTR__base_00112ca8;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = trial::protocol::bintoken::detail::basic_encoder<24UL>::array
                       ((basic_encoder<24UL> *)local_38,(type *)0x0,0);
  local_7c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.array(data.data(), data.size())","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x36d,"void compact_int8_suite::test_empty()",&local_88,&local_7c);
  local_88 = (long)local_78._M_impl.super__Vector_impl_data._M_finish -
             (long)local_78._M_impl.super__Vector_impl_data._M_start;
  local_7c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x36e,"void compact_int8_suite::test_empty()",&local_88,&local_7c);
  local_88._0_4_ = 0xa8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("buffer[0]","token::code::array8_int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x36f,"void compact_int8_suite::test_empty()",
             local_78._M_impl.super__Vector_impl_data._M_start,&local_88);
  local_88 = (ulong)local_88._4_4_ << 0x20;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[1]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x370,"void compact_int8_suite::test_empty()",
             local_78._M_impl.super__Vector_impl_data._M_start + 1,&local_88);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base(&local_58);
  (*(code *)*local_38[0])();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}